

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::Path::removeRedundantDirectorySeparators
          (string *__return_storage_ptr__,Path *this,string *path)

{
  string *psVar1;
  bool bVar2;
  string reducePath;
  allocator local_102;
  allocator local_101;
  string *local_100;
  string *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_100 = path;
  local_f8 = __return_storage_ptr__;
  do {
    ::std::__cxx11::string::string((string *)&local_50,(string *)local_100);
    ::std::__cxx11::string::string((string *)&local_90,(string *)&local_50);
    ::std::__cxx11::string::string((string *)&local_b0,"//",&local_101);
    ::std::__cxx11::string::string((string *)&local_d0,"/",&local_102);
    StringUtils::replaceAll(&local_70,&local_90,&local_b0,&local_d0);
    ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::string((string *)&local_f0,(string *)&local_50);
    ::std::__cxx11::string::string((string *)&local_b0,"\\\\",&local_101);
    ::std::__cxx11::string::string((string *)&local_d0,"\\",&local_102);
    StringUtils::replaceAll(&local_70,&local_f0,&local_b0,&local_d0);
    ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_f0);
    psVar1 = local_100;
    bVar2 = ::std::operator!=(&local_50,local_100);
    ::std::__cxx11::string::_M_assign((string *)psVar1);
    ::std::__cxx11::string::~string((string *)&local_50);
    psVar1 = local_f8;
  } while (bVar2);
  ::std::__cxx11::string::string((string *)local_f8,(string *)local_100);
  return psVar1;
}

Assistant:

std::string Path::removeRedundantDirectorySeparators(std::string path) const
    {
        bool changed = true;
        while (changed)
        {
            std::string reducePath = path;
            reducePath = StringUtils::replaceAll(reducePath, "//", "/");
            reducePath = StringUtils::replaceAll(reducePath, "\\\\", "\\");
            changed = (reducePath != path);
            path = reducePath;
        };
        return path;
    }